

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Buffers::DefaultsTest::CheckParameterError
          (DefaultsTest *this,GLchar *pname_string,GLchar *function_string)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  bool bVar4;
  Enum<int,_2UL> EVar5;
  Enum<int,_2UL> local_1d8 [2];
  MessageBuilder local_1b8;
  int local_34;
  long lStack_30;
  GLenum error;
  Functions *gl;
  GLchar *function_string_local;
  GLchar *pname_string_local;
  DefaultsTest *this_local;
  
  gl = (Functions *)function_string;
  function_string_local = pname_string;
  pname_string_local = (GLchar *)this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_30 = CONCAT44(extraout_var,iVar1);
  local_34 = (**(code **)(lStack_30 + 0x800))();
  bVar4 = local_34 == 0;
  if (!bVar4) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_1b8,(char **)&gl);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [14])0x2a79a4c);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&function_string_local);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [39])" parameter name unexpectedly returned ");
    EVar5 = glu::getErrorStr(local_34);
    local_1d8[0].m_getName = EVar5.m_getName;
    local_1d8[0].m_value = EVar5.m_value;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1d8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [7])0x2a671cf);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  }
  return bVar4;
}

Assistant:

bool DefaultsTest::CheckParameterError(const glw::GLchar* pname_string, const glw::GLchar* function_string)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Error check. */
	if (glw::GLenum error = gl.getError())
	{
		/* Log. */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << function_string << " called with "
											<< pname_string << " parameter name unexpectedly returned "
											<< glu::getErrorStr(error) << "error." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}